

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

QString * __thiscall
MakefileGenerator::fileFixify
          (QString *__return_storage_ptr__,MakefileGenerator *this,QString *file,FileFixifyTypes fix
          ,bool canon)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  SourceFiles *pSVar3;
  SourceFiles *pSVar4;
  QString file_00;
  QString file_01;
  QString string;
  QString file_02;
  QString string_00;
  QString string_01;
  QString string_02;
  QString file_03;
  QString string_03;
  undefined8 uVar5;
  qsizetype qVar6;
  undefined8 uVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  QArrayData *pQVar13;
  QArrayData *pQVar14;
  QMakeLocalFileName *pQVar15;
  ulong n;
  longlong lVar16;
  SourceFiles *pSVar17;
  longlong __tmp;
  Data *pDVar18;
  int iVar19;
  char16_t *tmp;
  Data *pDVar20;
  QMakeProject *pQVar21;
  QMakeProject *pQVar22;
  long in_FS_OFFSET;
  QLatin1String QVar23;
  QByteArrayView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  QAnyStringView QVar27;
  QAnyStringView QVar28;
  QStringView QVar29;
  QStringView QVar30;
  QStringView config;
  undefined1 in_stack_fffffffffffffe48 [12];
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_fffffffffffffe54;
  qsizetype in_stack_fffffffffffffe58;
  QStringBuilder<QString_&,_QString_&> local_188;
  QFileInfo in_fi;
  QMakeLocalFileName *pQStack_170;
  SourceFiles *local_168;
  QArrayData local_148;
  SourceFiles *local_138;
  QArrayData *local_130;
  char *local_128;
  undefined1 *puStack_120;
  QFileInfo qfileinfo;
  QFileInfo out_fi;
  QFileInfo in_fi_1;
  QMakeProject *pQStack_a0;
  QHash<QString,_bool> local_98;
  undefined1 local_88 [56];
  QHash<ReplaceExtraCompilerCacheKey,_QString> local_50;
  QHash<QString,_bool> local_48;
  QMakeProject *local_40;
  char16_t *local_38;
  
  pQVar21 = pQStack_a0;
  local_38 = *(char16_t **)(in_FS_OFFSET + 0x28);
  pQVar22 = (QMakeProject *)(file->d).size;
  if (pQVar22 == (QMakeProject *)0x0) {
    pDVar1 = (file->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (file->d).ptr;
    (__return_storage_ptr__->d).size = 0;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    goto LAB_00158b5a;
  }
  pDVar1 = (file->d).d;
  (__return_storage_ptr__->d).d = pDVar1;
  local_48.d = (Data *)(file->d).ptr;
  (__return_storage_ptr__->d).ptr = (char16_t *)local_48.d;
  (__return_storage_ptr__->d).size = (qsizetype)pQVar22;
  if (pDVar1 == (Data *)0x0) {
    local_50.d = (Data *)0x0;
  }
  else {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_50.d = (Data *)(__return_storage_ptr__->d).d;
    local_48.d = (Data *)(__return_storage_ptr__->d).ptr;
    pQVar22 = (QMakeProject *)(__return_storage_ptr__->d).size;
  }
  if (local_50.d != (Data *)0x0) {
    LOCK();
    (((QArrayData *)&(local_50.d)->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&(local_50.d)->ref)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_40 = pQVar22;
  cVar8 = QString::startsWith((QChar)(char16_t)__return_storage_ptr__,0x7e);
  if (cVar8 != '\0') {
    QVar23.m_data = (char *)0x2;
    QVar23.m_size = (qsizetype)__return_storage_ptr__;
    cVar8 = QString::startsWith(QVar23,0x2ad5fb);
    if (cVar8 == '\0') {
      QString::toLatin1_helper((QString *)local_88);
      pQVar22 = (QMakeProject *)local_88._8_8_;
      if ((QMakeProject *)local_88._8_8_ == (QMakeProject *)0x0) {
        pQVar22 = (QMakeProject *)&QByteArray::_empty;
      }
      warn_msg(WarnLogic,"Unable to expand ~ in %s",pQVar22);
      if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          lVar16 = 1;
          pQVar14 = (QArrayData *)local_88._0_8_;
          goto LAB_001579e9;
        }
      }
    }
    else {
      QDir::homePath();
      QString::mid((longlong)&out_fi,(longlong)__return_storage_ptr__);
      local_88._0_8_ = _in_fi_1;
      local_88._24_8_ = _out_fi;
      _in_fi_1 = (QArrayData *)0x0;
      pQStack_a0 = (QMakeProject *)0x0;
      local_88._8_8_ = pQVar21;
      local_88._16_8_ = local_98.d;
      _out_fi = (QArrayData *)0x0;
      QStringBuilder<QString,_QString>::convertTo<QString>
                ((QString *)&in_fi,(QStringBuilder<QString,_QString> *)local_88);
      pQVar14 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pQVar15 = (QMakeLocalFileName *)(__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = (Data *)_in_fi;
      (__return_storage_ptr__->d).ptr = (char16_t *)pQStack_170;
      pSVar17 = (SourceFiles *)(__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = (qsizetype)local_168;
      _in_fi = pQVar14;
      if (pQVar14 != (QArrayData *)0x0) {
        LOCK();
        (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar14,2,0x10);
        }
      }
      QStringBuilder<QString,_QString>::~QStringBuilder
                ((QStringBuilder<QString,_QString> *)local_88);
      if (_out_fi != (QArrayData *)0x0) {
        LOCK();
        (_out_fi->ref_)._q_value.super___atomic_base<int>._M_i =
             (_out_fi->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((_out_fi->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(_out_fi,2,0x10);
        }
      }
      pQStack_170 = pQVar15;
      local_168 = pSVar17;
      if (_in_fi_1 != (QArrayData *)0x0) {
        LOCK();
        (_in_fi_1->ref_)._q_value.super___atomic_base<int>._M_i =
             (_in_fi_1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((_in_fi_1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          lVar16 = 2;
          pQVar14 = _in_fi_1;
LAB_001579e9:
          QArrayData::deallocate(pQVar14,lVar16,0x10);
        }
      }
    }
  }
  pSVar17 = local_168;
  if (((uint)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
             super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i & 4) == 0) {
    if (((uint)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
               super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i & 8) == 0) {
      pQVar22 = this->project;
      QVar24.m_data = (storage_type *)0xa;
      QVar24.m_size = (qsizetype)local_88;
      QString::fromUtf8(QVar24);
      uVar5 = local_88._0_8_;
      config.m_data = (storage_type_conflict *)local_88._8_8_;
      config.m_size = local_88._16_8_;
      bVar9 = QMakeEvaluator::isActiveConfig(&pQVar22->super_QMakeEvaluator,config,false);
      if ((QArrayData *)uVar5 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar5)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar5)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar5)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
        }
      }
      in_stack_fffffffffffffe54.i =
           (Int)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
                super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i;
      if (bVar9) goto LAB_00158457;
    }
    pQVar14 = &(Option::output_dir.d.d)->super_QArrayData;
    pDVar18 = (Data *)Option::output_dir.d.size;
    pQVar22 = (QMakeProject *)Option::output_dir.d.ptr;
    if (((uint)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
               super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i & 2) != 0) {
      pQVar22 = this->project;
      pQVar14 = &((pQVar22->m_projectDir).d.d)->super_QArrayData;
      pDVar18 = (Data *)(pQVar22->m_projectDir).d.size;
      pQVar22 = (QMakeProject *)(pQVar22->m_projectDir).d.ptr;
    }
    if (pQVar14 == (QArrayData *)0x0) {
      pQVar14 = (QArrayData *)0x0;
    }
    else {
      LOCK();
      (((QArrayData *)&pQVar14->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&pQVar14->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (((uint)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
               super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i & 1) == 0) {
      pQVar21 = this->project;
      pQStack_a0 = (QMakeProject *)(pQVar21->m_projectDir).d.ptr;
      local_98.d = (Data *)(pQVar21->m_projectDir).d.size;
      pQVar13 = &((pQVar21->m_projectDir).d.d)->super_QArrayData;
    }
    else {
      pQStack_a0 = (QMakeProject *)Option::output_dir.d.ptr;
      local_98.d = (Data *)Option::output_dir.d.size;
      pQVar13 = &(Option::output_dir.d.d)->super_QArrayData;
    }
    pQVar21 = pQStack_a0;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    _in_fi = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    file_00.d.ptr._4_4_ = in_stack_fffffffffffffe54.i;
    file_00.d._0_12_ = in_stack_fffffffffffffe48;
    file_00.d.size = in_stack_fffffffffffffe58;
    _in_fi_1 = pQVar13;
    fileInfo((MakefileGenerator *)&in_fi,file_00);
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
    cVar8 = QFileInfo::exists();
    if (cVar8 != '\0') {
      QFileInfo::canonicalFilePath();
      uVar7 = local_88._16_8_;
      uVar5 = local_88._0_8_;
      pQVar13 = _in_fi_1;
      local_88._0_8_ = _in_fi_1;
      _in_fi_1 = (QArrayData *)uVar5;
      pQStack_a0 = (QMakeProject *)local_88._8_8_;
      local_88._8_8_ = pQVar21;
      local_88._16_8_ = local_98.d;
      local_98.d = (Data *)uVar7;
      if (pQVar13 != (QArrayData *)0x0) {
        LOCK();
        (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar13,2,0x10);
        }
      }
    }
    _out_fi = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    if (pQVar14 != (QArrayData *)0x0) {
      LOCK();
      (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    file_01.d.ptr._4_4_ = in_stack_fffffffffffffe54.i;
    file_01.d._0_12_ = in_stack_fffffffffffffe48;
    file_01.d.size = in_stack_fffffffffffffe58;
    fileInfo((MakefileGenerator *)&out_fi,file_01);
    if (pQVar14 != (QArrayData *)0x0) {
      LOCK();
      (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar14,2,0x10);
      }
    }
    cVar8 = QFileInfo::exists();
    pDVar20 = pDVar18;
    pQVar21 = pQVar22;
    pQVar13 = pQVar14;
    if ((cVar8 != '\0') &&
       (QFileInfo::canonicalFilePath(), pDVar20 = (Data *)local_88._16_8_,
       pQVar21 = (QMakeProject *)local_88._8_8_, pQVar13 = (QArrayData *)local_88._0_8_,
       local_88._0_8_ = pQVar14, local_88._8_8_ = pQVar22, local_88._16_8_ = pDVar18,
       pQVar14 != (QArrayData *)0x0)) {
      LOCK();
      (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar14,2,0x10);
      }
    }
    QFileInfo::~QFileInfo(&out_fi);
    QFileInfo::~QFileInfo(&in_fi);
    _out_fi = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_88._0_8_ = (__return_storage_ptr__->d).d;
    local_88._8_8_ = (__return_storage_ptr__->d).ptr;
    local_88._16_8_ = (__return_storage_ptr__->d).size;
    if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_88._0_8_)->ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((QArrayData *)local_88._0_8_)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    string.d.ptr._4_4_ = in_stack_fffffffffffffe54.i;
    string.d._0_12_ = in_stack_fffffffffffffe48;
    string.d.size = (qsizetype)pQVar13;
    Option::fixString((QString *)&out_fi,string,(uchar)local_88);
    if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    _qfileinfo = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_130 = _out_fi;
    local_128 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
    if (_out_fi != (QArrayData *)0x0) {
      LOCK();
      (_out_fi->ref_)._q_value.super___atomic_base<int>._M_i =
           (_out_fi->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    file_02.d.ptr._4_4_ = in_stack_fffffffffffffe54.i;
    file_02.d._0_12_ = in_stack_fffffffffffffe48;
    file_02.d.size = (qsizetype)pQVar13;
    fileInfo((MakefileGenerator *)&qfileinfo,file_02);
    if (local_130 != (QArrayData *)0x0) {
      LOCK();
      (local_130->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_130->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_130->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_130,2,0x10);
      }
    }
    pQVar14 = pQVar13;
    if (((pDVar20 == local_98.d) &&
        (QVar25.m_data = (storage_type_conflict *)pQVar21, QVar25.m_size = (qsizetype)pDVar20,
        QVar29.m_data = (storage_type_conflict *)pQStack_a0, QVar29.m_size = (qsizetype)pDVar20,
        cVar8 = QtPrivate::equalStrings(QVar25,QVar29), pQVar14 = pQVar13, cVar8 != '\0')) &&
       (cVar8 = QFileInfo::isRelative(), pQVar14 = pQVar13, cVar8 != '\0')) {
      local_88._0_8_ = (__return_storage_ptr__->d).d;
      local_88._8_8_ = (__return_storage_ptr__->d).ptr;
      local_88._16_8_ = (__return_storage_ptr__->d).size;
      if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_88._0_8_)->ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((QArrayData *)local_88._0_8_)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      string_00.d.ptr._4_4_ = in_stack_fffffffffffffe54.i;
      string_00.d._0_12_ = in_stack_fffffffffffffe48;
      string_00.d.size = (qsizetype)pQVar13;
      Option::fixString((QString *)&in_fi,string_00,(uchar)local_88);
      if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      pQVar14 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pSVar17 = (SourceFiles *)(__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = (Data *)_in_fi;
      (__return_storage_ptr__->d).ptr = (char16_t *)pQStack_170;
      (__return_storage_ptr__->d).size = (qsizetype)local_168;
      _in_fi = pQVar14;
      pQStack_170 = (QMakeLocalFileName *)pSVar17;
      if (pQVar14 != (QArrayData *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)&pQVar14->ref_)->d =
             *(int *)&((DataPointer *)&pQVar14->ref_)->d + -1;
        iVar10 = *(int *)&((DataPointer *)&pQVar14->ref_)->d;
        UNLOCK();
joined_r0x001588ea:
        if (iVar10 == 0) {
          QArrayData::deallocate(pQVar14,2,0x10);
        }
      }
    }
    else {
      cVar8 = QFileInfo::isRelative();
      if (cVar8 != '\0') {
        _in_fi = (QArrayData *)&in_fi_1;
        pQStack_170 = (QMakeLocalFileName *)0x2aaddb;
        QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>::convertTo<QString>
                  ((QString *)local_88,
                   (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)&in_fi
                  );
        pQVar13 = &((__return_storage_ptr__->d).d)->super_QArrayData;
        pQVar15 = (QMakeLocalFileName *)(__return_storage_ptr__->d).ptr;
        (__return_storage_ptr__->d).d = (Data *)local_88._0_8_;
        (__return_storage_ptr__->d).ptr = (char16_t *)local_88._8_8_;
        pDVar1 = (Data *)(__return_storage_ptr__->d).size;
        (__return_storage_ptr__->d).size = local_88._16_8_;
        local_88._0_8_ = pQVar13;
        local_88._8_8_ = pQVar15;
        local_88._16_8_ = pDVar1;
        if (pQVar13 != (QArrayData *)0x0) {
          LOCK();
          (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar13->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar13,2,0x10);
          }
        }
        QFileInfo::setFile((QString *)&qfileinfo);
        local_168 = (SourceFiles *)&out_fi;
      }
      local_88._0_8_ = (__return_storage_ptr__->d).d;
      local_88._8_8_ = (__return_storage_ptr__->d).ptr;
      local_88._16_8_ = (__return_storage_ptr__->d).size;
      if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_88._0_8_)->ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((QArrayData *)local_88._0_8_)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      string_01.d.ptr._4_4_ = in_stack_fffffffffffffe54.i;
      string_01.d._0_12_ = in_stack_fffffffffffffe48;
      string_01.d.size = (qsizetype)pQVar14;
      Option::fixString((QString *)&in_fi,string_01,(uchar)local_88);
      if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      pQVar2 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pSVar17 = (SourceFiles *)(__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = (Data *)_in_fi;
      (__return_storage_ptr__->d).ptr = (char16_t *)pQStack_170;
      pSVar3 = (SourceFiles *)(__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = (qsizetype)local_168;
      pQVar13 = pQVar14;
      _in_fi = pQVar2;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      local_138 = (SourceFiles *)&DAT_aaaaaaaaaaaaaaaa;
      local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_148.alloc = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      if (pQVar14 != (QArrayData *)0x0) {
        LOCK();
        (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      string_02.d.ptr._4_4_ = in_stack_fffffffffffffe54.i;
      string_02.d._0_12_ = in_stack_fffffffffffffe48;
      string_02.d.size = (qsizetype)pQVar13;
      local_88._0_8_ = pQVar14;
      local_88._8_8_ = pQVar21;
      local_88._16_8_ = pDVar20;
      Option::fixString((QString *)&local_148,string_02,(uchar)local_88);
      if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
      pSVar4 = (SourceFiles *)(__return_storage_ptr__->d).size;
      if ((pSVar4 == local_138) &&
         (QVar26.m_data = (__return_storage_ptr__->d).ptr, QVar26.m_size = (qsizetype)pSVar4,
         QVar30.m_data = (storage_type_conflict *)local_148.alloc, QVar30.m_size = (qsizetype)pSVar4
         , cVar8 = QtPrivate::equalStrings(QVar26,QVar30), cVar8 != '\0')) {
        QVar27.m_size = (size_t)"";
        QVar27.field_0.m_data = __return_storage_ptr__;
        QString::assign(QVar27);
        pQStack_170 = (QMakeLocalFileName *)pSVar17;
      }
      else {
        pQStack_170 = (QMakeLocalFileName *)&Option::dir_sep;
        _in_fi = &local_148;
        QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                  ((QString *)local_88,(QStringBuilder<QString_&,_QString_&> *)&in_fi);
        cVar8 = QString::startsWith((QString *)__return_storage_ptr__,
                                    (CaseSensitivity)(QString *)local_88);
        if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
        if (cVar8 == '\0') {
          if ((Option::qmake_mode & ~QMAKE_GENERATE_PROJECT) != QMAKE_GENERATE_MAKEFILE) {
LAB_001585ba:
            iVar10 = 4;
LAB_0015868f:
            local_88._16_8_ = (Data *)0x0;
            local_88._8_8_ = (QMakeProject *)0x0;
            local_88._0_8_ = (QArrayData *)0x0;
            iVar19 = 1;
            local_168 = pSVar3;
LAB_001586a2:
            iVar11 = QString::lastIndexOf((QString *)&local_148,0x2e5bf0,(CaseSensitivity)local_138)
            ;
            if (iVar11 != -1) {
              if ((SourceFiles *)(long)iVar11 < local_138) {
                QString::QString((QString *)&in_fi,(QChar *)local_148.alloc,(longlong)(long)iVar11);
              }
              else {
                _in_fi = (QArrayData *)local_148._0_8_;
                pQStack_170 = (QMakeLocalFileName *)local_148.alloc;
                local_168 = local_138;
                if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)local_148._0_8_)->d =
                       *(int *)&((DataPointer *)local_148._0_8_)->d + 1;
                  UNLOCK();
                }
              }
              pSVar3 = local_138;
              qVar6 = local_148.alloc;
              uVar5 = local_148._0_8_;
              pSVar17 = local_168;
              pQVar14 = _in_fi;
              _in_fi = (QArrayData *)local_148._0_8_;
              local_148._0_8_ = pQVar14;
              local_148.alloc = (qsizetype)pQStack_170;
              pQStack_170 = (QMakeLocalFileName *)qVar6;
              local_168 = local_138;
              local_138 = pSVar17;
              if ((QArrayData *)uVar5 != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)uVar5)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)uVar5)->_q_value).super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)uVar5)->_q_value).super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
                }
              }
              if (local_138 != (SourceFiles *)0x0) {
                local_188.b = &Option::dir_sep;
                local_188.a = (QString *)&local_148;
                QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                          ((QString *)&in_fi,&local_188);
                cVar8 = QString::startsWith((QString *)__return_storage_ptr__,
                                            (CaseSensitivity)&in_fi);
                if (_in_fi != (QArrayData *)0x0) {
                  LOCK();
                  (_in_fi->ref_)._q_value.super___atomic_base<int>._M_i =
                       (_in_fi->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((_in_fi->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(_in_fi,2,0x10);
                  }
                }
                if (cVar8 == '\0') goto code_r0x001587b8;
                uVar12 = ~(uint)local_138 + (int)(__return_storage_ptr__->d).size;
                n = 0;
                if (0 < (int)uVar12) {
                  n = (ulong)uVar12;
                }
                QString::right((QString *)&in_fi,__return_storage_ptr__,n);
                pQVar14 = &((__return_storage_ptr__->d).d)->super_QArrayData;
                (__return_storage_ptr__->d).d = (Data *)_in_fi;
                (__return_storage_ptr__->d).ptr = (char16_t *)qVar6;
                (__return_storage_ptr__->d).size = (qsizetype)pSVar3;
                if (pQVar14 != (QArrayData *)0x0) {
                  LOCK();
                  (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
                       (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    _in_fi = pQVar14;
                    QArrayData::deallocate(pQVar14,2,0x10);
                  }
                }
                do {
                  _in_fi = (QArrayData *)0x2b2b84;
                  pQStack_170 = (QMakeLocalFileName *)&Option::dir_sep;
                  ::operator+=((QString *)local_88,
                               (QStringBuilder<const_char_(&)[3],_QString_&> *)&in_fi);
                  iVar19 = iVar19 + -1;
                } while (iVar19 != 0);
              }
            }
            goto LAB_0015887b;
          }
          pQVar22 = this->project;
          if (pQVar22 == (QMakeProject *)0x0) {
LAB_001585a6:
            iVar10 = Option::mkfile::cachefile_depth;
            if (Option::mkfile::cachefile_depth == -1) goto LAB_001585ba;
          }
          else {
            ProKey::ProKey((ProKey *)local_88,"QMAKE_PROJECT_DEPTH");
            bVar9 = QMakeProject::isEmpty(pQVar22,(ProKey *)local_88);
            if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              }
            }
            if (bVar9) goto LAB_001585a6;
            pQVar22 = this->project;
            ProKey::ProKey((ProKey *)&in_fi,"QMAKE_PROJECT_DEPTH");
            QMakeEvaluator::first
                      ((ProString *)local_88,&pQVar22->super_QMakeEvaluator,(ProKey *)&in_fi);
            iVar10 = ProString::toInt((ProString *)local_88,(bool *)0x0,10);
            if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
              }
            }
            if (_in_fi != (QArrayData *)0x0) {
              LOCK();
              (_in_fi->ref_)._q_value.super___atomic_base<int>._M_i =
                   (_in_fi->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((_in_fi->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(_in_fi,2,0x10);
              }
            }
          }
          local_88._0_8_ = (QArrayData *)0x0;
          local_88._8_8_ = (QMakeProject *)0x0;
          local_88._16_8_ = (Data *)0x0;
          if (0 < iVar10) goto LAB_0015868f;
LAB_0015887b:
          pQVar22 = (QMakeProject *)local_88._8_8_;
          if ((QMakeProject *)local_88._8_8_ == (QMakeProject *)0x0) {
            pQVar22 = (QMakeProject *)&QString::_empty;
          }
          QString::insert((longlong)__return_storage_ptr__,(QChar *)0x0,(longlong)pQVar22);
        }
        else {
          QString::mid((longlong)local_88,(longlong)__return_storage_ptr__);
          pQVar14 = &((__return_storage_ptr__->d).d)->super_QArrayData;
          pQVar22 = (QMakeProject *)(__return_storage_ptr__->d).ptr;
          (__return_storage_ptr__->d).d = (Data *)local_88._0_8_;
          (__return_storage_ptr__->d).ptr = (char16_t *)local_88._8_8_;
          pDVar18 = (Data *)(__return_storage_ptr__->d).size;
          (__return_storage_ptr__->d).size = local_88._16_8_;
          local_88._0_8_ = pQVar14;
          local_88._8_8_ = pQVar22;
          local_88._16_8_ = pDVar18;
        }
        if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
          }
        }
      }
      uVar5 = local_148._0_8_;
      if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)local_148._0_8_)->d =
             *(int *)&((DataPointer *)local_148._0_8_)->d + -1;
        iVar10 = *(int *)&((DataPointer *)uVar5)->d;
        UNLOCK();
        pQVar14 = (QArrayData *)local_148._0_8_;
        goto joined_r0x001588ea;
      }
    }
    QFileInfo::~QFileInfo(&qfileinfo);
    if (_out_fi != (QArrayData *)0x0) {
      LOCK();
      (_out_fi->ref_)._q_value.super___atomic_base<int>._M_i =
           (_out_fi->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((_out_fi->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(_out_fi,2,0x10);
      }
    }
    if (_in_fi_1 != (QArrayData *)0x0) {
      LOCK();
      (_in_fi_1->ref_)._q_value.super___atomic_base<int>._M_i =
           (_in_fi_1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((_in_fi_1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(_in_fi_1,2,0x10);
      }
    }
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      iVar10 = (pQVar13->ref_)._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      pQVar15 = pQStack_170;
      goto joined_r0x00158968;
    }
  }
  else {
    cVar8 = QDir::isRelativePath((QString *)__return_storage_ptr__);
    if (cVar8 != '\0') {
      if (((uint)fix.super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
                 super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i & 1) == 0) {
        pQVar22 = this->project;
        local_88._8_8_ = (pQVar22->m_projectDir).d.ptr;
        local_88._16_8_ = (pQVar22->m_projectDir).d.size;
        pQVar14 = &((pQVar22->m_projectDir).d.d)->super_QArrayData;
      }
      else {
        local_88._8_8_ = Option::output_dir.d.ptr;
        local_88._16_8_ = Option::output_dir.d.size;
        pQVar14 = &(Option::output_dir.d.d)->super_QArrayData;
      }
      if (pQVar14 != (QArrayData *)0x0) {
        LOCK();
        (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      _in_fi_1 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      if (pQVar14 != (QArrayData *)0x0) {
        LOCK();
        (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      file_03.d.ptr._4_4_ = in_stack_fffffffffffffe54.i;
      file_03.d._0_12_ = in_stack_fffffffffffffe48;
      file_03.d.size = in_stack_fffffffffffffe58;
      local_88._0_8_ = pQVar14;
      fileInfo((MakefileGenerator *)&in_fi_1,file_03);
      if (pQVar14 != (QArrayData *)0x0) {
        LOCK();
        (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar14,2,0x10);
        }
      }
      cVar8 = QFileInfo::exists();
      if (cVar8 != '\0') {
        QFileInfo::canonicalFilePath();
        uVar7 = local_88._8_8_;
        uVar5 = local_88._0_8_;
        pQVar14 = _in_fi;
        _in_fi = (QArrayData *)local_88._0_8_;
        local_88._0_8_ = pQVar14;
        local_88._8_8_ = pQStack_170;
        pQStack_170 = (QMakeLocalFileName *)uVar7;
        local_168 = (SourceFiles *)local_88._16_8_;
        local_88._16_8_ = pSVar17;
        if ((QArrayData *)uVar5 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar5)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar5)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)uVar5)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)uVar5,2,0x10);
          }
        }
      }
      QFileInfo::~QFileInfo(&in_fi_1);
      cVar8 = QString::endsWith((QChar)(char16_t)local_88,0x2f);
      if (cVar8 == '\0') {
        QString::append((QChar)(char16_t)local_88);
      }
      pQVar15 = (QMakeLocalFileName *)local_88._8_8_;
      if ((QMakeLocalFileName *)local_88._8_8_ == (QMakeLocalFileName *)0x0) {
        pQVar15 = (QMakeLocalFileName *)&QString::_empty;
      }
      QString::insert((longlong)__return_storage_ptr__,(QChar *)0x0,(longlong)pQVar15);
      if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
        }
      }
    }
LAB_00158457:
    local_88._0_8_ = (__return_storage_ptr__->d).d;
    local_88._8_8_ = (__return_storage_ptr__->d).ptr;
    local_88._16_8_ = (__return_storage_ptr__->d).size;
    if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_88._0_8_)->ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((QArrayData *)local_88._0_8_)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    string_03.d.ptr._4_4_ = in_stack_fffffffffffffe54.i;
    string_03.d._0_12_ = in_stack_fffffffffffffe48;
    string_03.d.size = in_stack_fffffffffffffe58;
    Option::fixString((QString *)&in_fi,string_03,(uchar)local_88);
    if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
    pQVar13 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pQVar15 = (QMakeLocalFileName *)(__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)_in_fi;
    (__return_storage_ptr__->d).ptr = (char16_t *)pQStack_170;
    (__return_storage_ptr__->d).size = (qsizetype)local_168;
    _in_fi = pQVar13;
    pQStack_170 = pQVar15;
    if (pQVar13 != (QArrayData *)0x0) {
      LOCK();
      *(int *)&((DataPointer *)&pQVar13->ref_)->d = *(int *)&((DataPointer *)&pQVar13->ref_)->d + -1
      ;
      iVar10 = *(int *)&((DataPointer *)&pQVar13->ref_)->d;
      UNLOCK();
joined_r0x00158968:
      pQStack_170 = pQVar15;
      if (iVar10 == 0) {
        QArrayData::deallocate(pQVar13,2,0x10);
      }
    }
  }
  if ((__return_storage_ptr__->d).size == 0) {
    QVar28.m_size = (size_t)".";
    QVar28.field_0.m_data = __return_storage_ptr__;
    QString::assign(QVar28);
  }
  if (Option::debug_level != 0) {
    QString::toLatin1_helper((QString *)local_88);
    pQVar22 = (QMakeProject *)local_88._8_8_;
    if ((QMakeProject *)local_88._8_8_ == (QMakeProject *)0x0) {
      pQVar22 = (QMakeProject *)&QByteArray::_empty;
    }
    QString::toLatin1_helper((QString *)&in_fi);
    if (pQStack_170 == (QMakeLocalFileName *)0x0) {
      pQStack_170 = (QMakeLocalFileName *)&QByteArray::_empty;
    }
    qmake_getpwd();
    QString::toLatin1_helper_inplace((QString *)&in_fi_1);
    if (pQStack_a0 == (QMakeProject *)0x0) {
      pQStack_a0 = (QMakeProject *)&QByteArray::_empty;
    }
    QString::toLatin1_helper((QString *)&local_148);
    pSVar17 = (SourceFiles *)local_148.alloc;
    if ((SourceFiles *)local_148.alloc == (SourceFiles *)0x0) {
      pSVar17 = (SourceFiles *)&QByteArray::_empty;
    }
    debug_msg_internal(3,"Fixed[%d,%d] %s :: to :: %s [%s::%s]",
                       (ulong)(uint)fix.
                                    super_QFlagsStorageHelper<MakefileGenerator::FileFixifyType,_4>.
                                    super_QFlagsStorage<MakefileGenerator::FileFixifyType>.i,canon,
                       pQVar22,pQStack_170,pQStack_a0,pSVar17);
    uVar5 = local_148._0_8_;
    if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
      LOCK();
      *(int *)&((DataPointer *)local_148._0_8_)->d =
           *(int *)&((DataPointer *)local_148._0_8_)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)uVar5)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_148._0_8_,1,0x10);
      }
    }
    if (_in_fi_1 != (QArrayData *)0x0) {
      LOCK();
      (_in_fi_1->ref_)._q_value.super___atomic_base<int>._M_i =
           (_in_fi_1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((_in_fi_1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(_in_fi_1,1,0x10);
      }
    }
    if (_out_fi != (QArrayData *)0x0) {
      LOCK();
      (_out_fi->ref_)._q_value.super___atomic_base<int>._M_i =
           (_out_fi->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((_out_fi->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(_out_fi,2,0x10);
      }
    }
    if (_in_fi != (QArrayData *)0x0) {
      LOCK();
      (_in_fi->ref_)._q_value.super___atomic_base<int>._M_i =
           (_in_fi->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((_in_fi->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(_in_fi,1,0x10);
      }
    }
    if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
      }
    }
  }
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_50.d,2,0x10);
    }
  }
LAB_00158b5a:
  if (*(char16_t **)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
code_r0x001587b8:
  bVar9 = iVar19 == iVar10;
  iVar19 = iVar19 + 1;
  if (bVar9) goto LAB_0015887b;
  goto LAB_001586a2;
}

Assistant:

QString
MakefileGenerator::fileFixify(const QString &file, FileFixifyTypes fix, bool canon) const
{
    if(file.isEmpty())
        return file;
    QString ret = file;

    //do the fixin'
    QString orig_file = ret;
    if(ret.startsWith(QLatin1Char('~'))) {
        if(ret.startsWith(QLatin1String("~/")))
            ret = QDir::homePath() + ret.mid(1);
        else
            warn_msg(WarnLogic, "Unable to expand ~ in %s", ret.toLatin1().constData());
    }
    if ((fix & FileFixifyAbsolute)
            || (!(fix & FileFixifyRelative) && project->isActiveConfig("no_fixpath"))) {
        if ((fix & FileFixifyAbsolute) && QDir::isRelativePath(ret)) {
            QString pwd = !(fix & FileFixifyFromOutdir) ? project->projectDir() : Option::output_dir;
            {
                QFileInfo in_fi(fileInfo(pwd));
                if (in_fi.exists())
                    pwd = in_fi.canonicalFilePath();
            }
            if (!pwd.endsWith(QLatin1Char('/')))
                pwd += QLatin1Char('/');
            ret.prepend(pwd);
        }
        ret = Option::fixPathToTargetOS(ret, false, canon);
    } else { //fix it..
        QString out_dir = (fix & FileFixifyToIndir) ? project->projectDir() : Option::output_dir;
        QString in_dir  = !(fix & FileFixifyFromOutdir) ? project->projectDir() : Option::output_dir;
        {
            QFileInfo in_fi(fileInfo(in_dir));
            if(in_fi.exists())
                in_dir = in_fi.canonicalFilePath();
            QFileInfo out_fi(fileInfo(out_dir));
            if(out_fi.exists())
                out_dir = out_fi.canonicalFilePath();
        }

        QString qfile(Option::normalizePath(ret));
        QFileInfo qfileinfo(fileInfo(qfile));
        if(out_dir != in_dir || !qfileinfo.isRelative()) {
            if(qfileinfo.isRelative()) {
                ret = in_dir + "/" + qfile;
                qfileinfo.setFile(ret);
            }
            ret = Option::fixPathToTargetOS(ret, false, canon);
            QString match_dir = Option::fixPathToTargetOS(out_dir, false, canon);
            if(ret == match_dir) {
                ret = "";
            } else if(ret.startsWith(match_dir + Option::dir_sep)) {
                ret = ret.mid(match_dir.size() + Option::dir_sep.size());
            } else {
                //figure out the depth
                int depth = 4;
                if(Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
                   Option::qmake_mode == Option::QMAKE_GENERATE_PRL) {
                    if(project && !project->isEmpty("QMAKE_PROJECT_DEPTH"))
                        depth = project->first("QMAKE_PROJECT_DEPTH").toInt();
                    else if(Option::mkfile::cachefile_depth != -1)
                        depth = Option::mkfile::cachefile_depth;
                }
                //calculate how much can be removed
                QString dot_prefix;
                for(int i = 1; i <= depth; i++) {
                    int sl = match_dir.lastIndexOf(Option::dir_sep);
                    if(sl == -1)
                        break;
                    match_dir = match_dir.left(sl);
                    if(match_dir.isEmpty())
                        break;
                    if(ret.startsWith(match_dir + Option::dir_sep)) {
                        //concat
                        int remlen = ret.size() - (match_dir.size() + 1);
                        if(remlen < 0)
                            remlen = 0;
                        ret = ret.right(remlen);
                        //prepend
                        for(int o = 0; o < i; o++)
                            dot_prefix += ".." + Option::dir_sep;
                        break;
                    }
                }
                ret.prepend(dot_prefix);
            }
        } else {
            ret = Option::fixPathToTargetOS(ret, false, canon);
        }
    }
    if(ret.isEmpty())
        ret = ".";
    debug_msg(3, "Fixed[%d,%d] %s :: to :: %s [%s::%s]",
              int(fix), canon, orig_file.toLatin1().constData(), ret.toLatin1().constData(),
              qmake_getpwd().toLatin1().constData(), Option::output_dir.toLatin1().constData());
    return ret;
}